

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPT.cpp
# Opt level: O0

string * __thiscall CPT::SoftPrint_abi_cxx11_(CPT *this)

{
  size_type sVar1;
  size_type sVar2;
  ostream *poVar3;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this_00;
  long in_RSI;
  string *in_RDI;
  size_t x;
  size_t y;
  size_t Y;
  size_t X;
  stringstream ss;
  const_reference in_stack_fffffffffffffdf0;
  ulong local_1c8;
  ulong local_1c0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  sVar1 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size1((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)(in_RSI + 8));
  sVar2 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size2((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)(in_RSI + 8));
  for (local_1c0 = 0; local_1c0 < sVar2; local_1c0 = local_1c0 + 1) {
    poVar3 = std::operator<<(local_188,"CPT y=");
    this_00 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)std::ostream::operator<<(poVar3,local_1c0);
    std::operator<<((ostream *)this_00," x:");
    for (local_1c8 = 0; local_1c8 < sVar1; local_1c8 = local_1c8 + 1) {
      poVar3 = std::operator<<(local_188," ");
      in_stack_fffffffffffffdf0 =
           boost::numeric::ublas::
           matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           ::operator()(this_00,(size_type)poVar3,(size_type)in_stack_fffffffffffffdf0);
      std::ostream::operator<<(poVar3,*in_stack_fffffffffffffdf0);
    }
    std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string CPT::SoftPrint() const
{
    stringstream ss;
    size_t X = _m_probTable.size1();
    size_t Y = _m_probTable.size2();
    for(size_t y=0; y < Y; y++) 
    {
        ss << "CPT y=" << y << " x:";
        for(size_t x=0; x < X; x++) 
            ss << " " << _m_probTable(x,y);
        ss << endl;
    }
    return(ss.str());
}